

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad.c
# Opt level: O0

int intglobal(void)

{
  int iVar1;
  symboltype sVar2;
  int iVar3;
  bool bVar4;
  int local_18;
  int local_14;
  int tempcopied;
  int tempused;
  int j;
  int i;
  
  for (tempused = 0; tempused < numcodes; tempused = tempused + 1) {
    if ((intcode[tempused].opcode == opassn) &&
       (sVar2 = symclass(intcode[tempused].op1.opnd), sVar2 == sttempvar)) {
      local_18 = 0;
      iVar1 = tempused;
      while( true ) {
        tempcopied = iVar1 + 1;
        bVar4 = false;
        if (tempcopied < numcodes) {
          iVar3 = insamebb(tempcopied);
          bVar4 = false;
          if (iVar3 != 0) {
            bVar4 = local_18 == 0;
          }
        }
        if (!bVar4) break;
        local_18 = copyprop(tempused,tempcopied);
        iVar1 = tempcopied;
      }
      if (local_18 == 1) {
        intcode[iVar1].op2 = intcode[tempused].op2;
        intcode[tempused].opcode = opnull;
      }
      else if (local_18 == 2) {
        intcode[iVar1].op3 = intcode[tempused].op2;
        intcode[tempused].opcode = opnull;
      }
    }
  }
  for (tempused = 0; tempused < numcodes; tempused = tempused + 1) {
    if ((intcode[tempused].opcode == opassn) &&
       (sVar2 = symclass(intcode[tempused].op1.opnd), sVar2 == sttempvar)) {
      local_14 = 0;
      tempcopied = tempused;
      while (tempcopied = tempcopied + 1, tempcopied < numcodes && local_14 == 0) {
        local_14 = codeappears(tempused,tempcopied);
      }
      if (local_14 == 0) {
        intcode[tempused].opcode = opnull;
      }
    }
  }
  packcode();
  return numcodes;
}

Assistant:

int	intglobal(void)
{
    int	i, j, tempused, tempcopied;
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempcopied = 0;
            for (j = i + 1;  j < numcodes && insamebb(j)
                 && !tempcopied;  j++)
                tempcopied = copyprop(i, j);
            if (tempcopied == 1)	{
                intcode[j-1].op2 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
            else if (tempcopied == 2)	{
                intcode[j-1].op3 = intcode[i].op2;
                intcode[i].opcode = opnull;
            }
        }
    
    for (i = 0;  i < numcodes;  i++)
        if (intcode[i].opcode == opassn
            && symclass(intcode[i].op1.opnd) == sttempvar)	{
            tempused = 0;
            for (j = i + 1;  j < numcodes && !tempused;  j++)
                tempused = codeappears(i, j);
            if (!tempused)
                intcode[i].opcode = opnull;
        }
    packcode();
    
    return(numcodes);
}